

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O2

int run_test_thread_stack_size_explicit(void)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t thread;
  uv_thread_options_t options;
  
  options.flags = 1;
  options.stack_size = 0x100000;
  iVar1 = uv_thread_create_ex(&thread,&options,thread_check_stack,&options);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    iVar1 = uv_thread_join(&thread);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      options.stack_size = 0x800000;
      iVar1 = uv_thread_create_ex(&thread,&options,thread_check_stack,&options);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        iVar1 = uv_thread_join(&thread);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          options.stack_size = 0;
          iVar1 = uv_thread_create_ex(&thread,&options,thread_check_stack,&options);
          eval_a = (int64_t)iVar1;
          if (eval_a == 0) {
            iVar1 = uv_thread_join(&thread);
            eval_a = (int64_t)iVar1;
            if (eval_a == 0) {
              options.stack_size = 0x2a;
              iVar1 = uv_thread_create_ex(&thread,&options,thread_check_stack,&options);
              eval_a = (int64_t)iVar1;
              if (eval_a == 0) {
                iVar1 = uv_thread_join(&thread);
                eval_a = (int64_t)iVar1;
                if (eval_a == 0) {
                  lVar2 = __sysconf(0x4b);
                  options.stack_size = lVar2 - 0x2a;
                  iVar1 = uv_thread_create_ex(&thread,&options,thread_check_stack,&options);
                  eval_a = (int64_t)iVar1;
                  if (eval_a == 0) {
                    iVar1 = uv_thread_join(&thread);
                    eval_a = (int64_t)iVar1;
                    if (eval_a == 0) {
                      lVar2 = __sysconf(0x4b);
                      options.stack_size = lVar2 / 2 - 0x2a;
                      iVar1 = uv_thread_create_ex(&thread,&options,thread_check_stack,&options);
                      eval_a = (int64_t)iVar1;
                      if (eval_a == 0) {
                        iVar1 = uv_thread_join(&thread);
                        eval_a = (int64_t)iVar1;
                        if (eval_a == 0) {
                          options.stack_size = 0x12d687;
                          iVar1 = uv_thread_create_ex(&thread,&options,thread_check_stack,&options);
                          eval_a = (int64_t)iVar1;
                          if (eval_a == 0) {
                            iVar1 = uv_thread_join(&thread);
                            eval_a = (int64_t)iVar1;
                            if (eval_a == 0) {
                              return 0;
                            }
                            pcVar4 = "uv_thread_join(&thread)";
                            uVar3 = 0x125;
                          }
                          else {
                            pcVar4 = 
                            "uv_thread_create_ex(&thread, &options, thread_check_stack, &options)";
                            uVar3 = 0x124;
                          }
                        }
                        else {
                          pcVar4 = "uv_thread_join(&thread)";
                          uVar3 = 0x11e;
                        }
                      }
                      else {
                        pcVar4 = 
                        "uv_thread_create_ex(&thread, &options, thread_check_stack, &options)";
                        uVar3 = 0x11d;
                      }
                    }
                    else {
                      pcVar4 = "uv_thread_join(&thread)";
                      uVar3 = 0x119;
                    }
                  }
                  else {
                    pcVar4 = "uv_thread_create_ex(&thread, &options, thread_check_stack, &options)";
                    uVar3 = 0x118;
                  }
                }
                else {
                  pcVar4 = "uv_thread_join(&thread)";
                  uVar3 = 0x113;
                }
              }
              else {
                pcVar4 = "uv_thread_create_ex(&thread, &options, thread_check_stack, &options)";
                uVar3 = 0x112;
              }
            }
            else {
              pcVar4 = "uv_thread_join(&thread)";
              uVar3 = 0x10e;
            }
          }
          else {
            pcVar4 = "uv_thread_create_ex(&thread, &options, thread_check_stack, &options)";
            uVar3 = 0x10d;
          }
        }
        else {
          pcVar4 = "uv_thread_join(&thread)";
          uVar3 = 0x109;
        }
      }
      else {
        pcVar4 = "uv_thread_create_ex(&thread, &options, thread_check_stack, &options)";
        uVar3 = 0x108;
      }
    }
    else {
      pcVar4 = "uv_thread_join(&thread)";
      uVar3 = 0x104;
    }
  }
  else {
    pcVar4 = "uv_thread_create_ex(&thread, &options, thread_check_stack, &options)";
    uVar3 = 0x103;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
          ,uVar3,pcVar4,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

TEST_IMPL(thread_stack_size_explicit) {
  uv_thread_t thread;
  uv_thread_options_t options;

  options.flags = UV_THREAD_HAS_STACK_SIZE;
  options.stack_size = 1024 * 1024;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 8 * 1024 * 1024;  /* larger than most default os sizes */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 0;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = 42;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

#ifdef PTHREAD_STACK_MIN
  options.stack_size = PTHREAD_STACK_MIN - 42;  /* unaligned size */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  options.stack_size = PTHREAD_STACK_MIN / 2 - 42;  /* unaligned size */
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));
#endif

  /* unaligned size, should be larger than PTHREAD_STACK_MIN */
  options.stack_size = 1234567;
  ASSERT_OK(uv_thread_create_ex(&thread, &options,
                                thread_check_stack, &options));
  ASSERT_OK(uv_thread_join(&thread));

  return 0;
}